

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::BuildNode::configureAttribute
          (BuildNode *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  int iVar1;
  Twine *this_00;
  StringRef name_local;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  name_local.Length = name.Length;
  name_local.Data = name.Data;
  if (name_local.Length == 0x15) {
    iVar1 = bcmp(name_local.Data,"must-scan-after-paths",0x15);
    if (iVar1 == 0) {
      this_00 = &local_50;
      basic::StringList::StringList<llvm::StringRef>((StringList *)this_00,values);
      basic::StringList::getValues
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_68,
                 (StringList *)this_00);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::_M_move_assign
                (&this->mustScanAfterPaths,&local_68);
      std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_68);
      goto LAB_001667d6;
    }
  }
  else if ((name_local.Length == 0x1a) &&
          (iVar1 = bcmp(name_local.Data,"content-exclusion-patterns",0x1a), iVar1 == 0)) {
    this_00 = &local_68;
    basic::StringList::StringList<llvm::StringRef>((StringList *)this_00,values);
    basic::StringList::operator=(&this->exclusionPatterns,(StringList *)this_00);
LAB_001667d6:
    basic::StringList::~StringList((StringList *)this_00);
    return true;
  }
  llvm::Twine::Twine(&local_50,"unexpected attribute: \'",&name_local);
  llvm::Twine::Twine(&local_38,"\'");
  llvm::Twine::concat(&local_68,&local_50,&local_38);
  ConfigureContext::error(ctx,&local_68);
  return false;
}

Assistant:

bool BuildNode::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                   ArrayRef<StringRef> values) {
  if (name == "content-exclusion-patterns") {
    exclusionPatterns = basic::StringList(values);
    return true;
  } else if (name == "must-scan-after-paths") {
    mustScanAfterPaths = basic::StringList(values).getValues();
    return true;
  }

  // We don't support any other custom attributes.
  ctx.error("unexpected attribute: '" + name + "'");
  return false;
}